

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O3

void EpdAdd3(EpDouble *epd1,EpDouble *epd2,EpDouble *epd3)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  EpType val;
  
  dVar1 = (epd1->type).value;
  if (((uint)((ulong)dVar1 >> 0x34) < 0xfff || ((ulong)dVar1 & 0xfffffffffffff) != 0x8000000000000)
     && (dVar6 = (epd2->type).value,
        ((ulong)dVar6 & 0xfffffffffffff) != 0x8000000000000 || (ulong)dVar6 < 0xfff0000000000000)) {
    if (ABS(dVar1) == INFINITY) {
      if ((ABS(dVar6) == INFINITY) && ((long)((ulong)dVar6 ^ (ulong)dVar1) < 0)) goto LAB_0081b1b9;
      (epd3->type).value = dVar1;
      iVar2 = epd1->exponent;
    }
    else {
      if (ABS(dVar6) != INFINITY) {
        if (((ulong)dVar1 & 0x7ff0000000000000) != 0x3ff0000000000000) {
          __assert_fail("epd1->type.bits.exponent == EPD_MAX_BIN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/epd/epd.c"
                        ,0x2ad,"void EpdAdd3(EpDouble *, EpDouble *, EpDouble *)");
        }
        if (((ulong)dVar6 & 0x7ff0000000000000) != 0x3ff0000000000000) {
          __assert_fail("epd2->type.bits.exponent == EPD_MAX_BIN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/epd/epd.c"
                        ,0x2ae,"void EpdAdd3(EpDouble *, EpDouble *, EpDouble *)");
        }
        iVar3 = epd1->exponent;
        iVar2 = epd2->exponent;
        iVar4 = iVar3 - iVar2;
        if (iVar4 == 0 || iVar3 < iVar2) {
          if (iVar3 < iVar2) {
            iVar4 = iVar2 - iVar3;
            iVar3 = iVar2;
            dVar5 = dVar6;
            if (iVar4 < 0x400) {
              dVar6 = ldexp(1.0,iVar4);
              iVar3 = epd2->exponent;
              dVar5 = dVar1 / dVar6 + (epd2->type).value;
            }
          }
          else {
            dVar5 = dVar6 + dVar1;
          }
        }
        else {
          dVar5 = dVar1;
          if (iVar4 < 0x400) {
            dVar5 = ldexp(1.0,iVar4);
            iVar3 = epd1->exponent;
            dVar5 = dVar6 / dVar5 + dVar1;
          }
        }
        (epd3->type).value = dVar5;
        epd3->exponent = iVar3;
        EpdNormalize(epd3);
        return;
      }
      (epd3->type).value = dVar6;
      iVar2 = epd2->exponent;
    }
    epd3->exponent = iVar2;
  }
  else {
LAB_0081b1b9:
    (epd3->type).value = -NAN;
    epd3->exponent = 0;
  }
  return;
}

Assistant:

void
EpdAdd3(EpDouble *epd1, EpDouble *epd2, EpDouble *epd3)
{
  double        value;
  int           exponent, diff;

  if (EpdIsNan(epd1) || EpdIsNan(epd2)) {
    EpdMakeNan(epd3);
    return;
  } else if (EpdIsInf(epd1) || EpdIsInf(epd2)) {
    int sign;

    if (EpdIsInf(epd1) && EpdIsInf(epd2)) {
      sign = epd1->type.bits.sign ^ epd2->type.bits.sign;
      if (sign == 1)
        EpdMakeNan(epd3);
      else
        EpdCopy(epd1, epd3);
    } else if (EpdIsInf(epd1)) {
      EpdCopy(epd1, epd3);
    } else {
      EpdCopy(epd2, epd3);
    }
    return;
  }

  assert(epd1->type.bits.exponent == EPD_MAX_BIN);
  assert(epd2->type.bits.exponent == EPD_MAX_BIN);

  if (epd1->exponent > epd2->exponent) {
    diff = epd1->exponent - epd2->exponent;
    if (diff <= EPD_MAX_BIN) {
      value = epd1->type.value +
                epd2->type.value / pow((double)2.0, (double)diff);
    } else
      value = epd1->type.value;
    exponent = epd1->exponent;
  } else if (epd1->exponent < epd2->exponent) {
    diff = epd2->exponent - epd1->exponent;
    if (diff <= EPD_MAX_BIN) {
      value = epd1->type.value / pow((double)2.0, (double)diff) +
                epd2->type.value;
    } else
      value = epd2->type.value;
    exponent = epd2->exponent;
  } else {
    value = epd1->type.value + epd2->type.value;
    exponent = epd1->exponent;
  }
  epd3->type.value = value;
  epd3->exponent = exponent;
  EpdNormalize(epd3);
}